

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void lang_help(TidyDoc tdoc)

{
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  
  putchar(10);
  ptVar1 = tidyLocalizedString(0x35e);
  printf(anon_var_dwarf_1996a + 0x16,ptVar1);
  putchar(10);
  tidyPrintWindowsLanguageNames("  %-20s -> %s\n");
  putchar(10);
  ptVar1 = tidyLocalizedString(0x35f);
  printf(anon_var_dwarf_1996a + 0x16,ptVar1);
  putchar(10);
  tidyPrintTidyLanguageNames("  %s\n");
  putchar(10);
  ptVar1 = tidyLocalizedString(0x360);
  ptVar2 = tidyGetLanguage();
  printf(ptVar1,ptVar2);
  putchar(10);
  return;
}

Assistant:

static void lang_help( TidyDoc tdoc )
{
    printf( "\n" );
    printf( "%s", tidyLocalizedString(TC_TXT_HELP_LANG_1) );
    printf( "\n" );
    tidyPrintWindowsLanguageNames("  %-20s -> %s\n");
    printf( "\n" );
    printf( "%s", tidyLocalizedString(TC_TXT_HELP_LANG_2) );
    printf( "\n" );
    tidyPrintTidyLanguageNames("  %s\n");
    printf( "\n" );
    printf( tidyLocalizedString(TC_TXT_HELP_LANG_3), tidyGetLanguage() );
    printf( "\n" );
}